

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

bool __thiscall
CLIntercept::checkRelaxAllocationLimitsSupport
          (CLIntercept *this,cl_uint numDevices,cl_device_id *deviceList)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  cl_uint deviceVendorId;
  cl_device_type deviceType;
  
  uVar5 = 0;
  uVar1 = 0;
  while (uVar4 = uVar1, numDevices != uVar4) {
    deviceType = 0;
    uVar2 = (*(this->m_Dispatch).clGetDeviceInfo)
                      (deviceList[uVar4],0x1000,8,&deviceType,(size_t *)0x0);
    uVar3 = (*(this->m_Dispatch).clGetDeviceInfo)
                      (deviceList[uVar4],0x1001,4,&deviceVendorId,(size_t *)0x0);
    uVar5 = uVar5 | uVar3 | uVar2;
    if (((deviceType & 4) == 0) || (uVar1 = uVar4 + 1, deviceVendorId != 0x8086)) break;
  }
  return uVar5 == 0 && numDevices <= uVar4;
}

Assistant:

bool CLIntercept::checkRelaxAllocationLimitsSupport(
    cl_uint numDevices,
    const cl_device_id* deviceList ) const
{
    cl_int  errorCode = CL_SUCCESS;
    bool    supported = true;

    // For now, check for Intel GPU devices to determine whether relaxed
    // allocations are supported.  Eventually this can be checked using
    // formal mechanisms.

    for( cl_uint i = 0; i < numDevices; i++ )
    {
        cl_device_type  deviceType = 0;
        cl_uint deviceVendorId;

        errorCode |= dispatch().clGetDeviceInfo(
            deviceList[ i ],
            CL_DEVICE_TYPE,
            sizeof( deviceType ),
            &deviceType,
            NULL );
        errorCode |= dispatch().clGetDeviceInfo(
            deviceList[ i ],
            CL_DEVICE_VENDOR_ID,
            sizeof( deviceVendorId ),
            &deviceVendorId,
            NULL );
        if( ( deviceType & CL_DEVICE_TYPE_GPU ) == 0 ||
            deviceVendorId != 0x8086 )
        {
            supported = false;
            break;
        }
    }

    return ( errorCode == CL_SUCCESS ) && supported;
}